

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O1

void __thiscall
TPZBlockDiagonal<std::complex<double>_>::AutoFill
          (TPZBlockDiagonal<std::complex<double>_> *this,int64_t neq,int64_t jeq,int symmetric)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  complex<double> *pcVar4;
  double dVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar18;
  TPZStack<int,_10> blsizes;
  double local_b8;
  TPZManVector<int,_10> local_78;
  
  if (neq == jeq) {
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
    if (0 < neq) {
      lVar9 = 0;
      do {
        iVar7 = rand();
        lVar8 = (iVar7 * neq) / 0x7fffffff;
        lVar11 = neq - lVar9;
        if (lVar8 < neq - lVar9) {
          lVar11 = lVar8;
        }
        TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,(int)lVar11);
        lVar9 = lVar9 + lVar11;
      } while (lVar9 < neq);
    }
    Initialize(this,&local_78.super_TPZVec<int>);
    lVar9 = (this->fBlockSize).fNElements;
    if (0 < lVar9) {
      lVar8 = 0;
      do {
        lVar11 = (long)(this->fBlockSize).fStore[lVar8];
        if (0 < lVar11) {
          lVar3 = (this->fBlockPos).fStore[lVar8];
          lVar14 = lVar3 << 4;
          lVar13 = lVar11 * 0x10;
          lVar10 = 0;
          lVar16 = lVar14;
          do {
            dVar18 = 0.0;
            if (lVar10 == 0 || symmetric != 1) {
              lVar17 = 0;
            }
            else {
              lVar17 = 0;
              lVar12 = lVar14;
              lVar15 = lVar16;
              do {
                pcVar4 = (this->fStorage).fStore;
                puVar1 = (undefined8 *)(pcVar4->_M_value + lVar15);
                uVar6 = puVar1[1];
                puVar2 = (undefined8 *)(pcVar4->_M_value + lVar12);
                *puVar2 = *puVar1;
                puVar2[1] = uVar6;
                dVar5 = cabs(*(double *)(((this->fStorage).fStore)->_M_value + lVar15));
                dVar18 = dVar18 + ABS(dVar5);
                lVar17 = lVar17 + 1;
                lVar12 = lVar12 + lVar13;
                lVar15 = lVar15 + 0x10;
              } while (lVar10 != lVar17);
            }
            local_b8 = dVar18;
            if (lVar17 < lVar11) {
              lVar12 = lVar13 * lVar17 + lVar14;
              do {
                TPZMatrix<std::complex<double>_>::GetRandomVal
                          (&this->super_TPZMatrix<std::complex<double>_>);
                pcVar4 = (this->fStorage).fStore;
                *(ulong *)(pcVar4->_M_value + lVar12) = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
                *(double *)(pcVar4->_M_value + lVar12 + 8) = dVar18;
                if (lVar10 != lVar17) {
                  dVar18 = cabs((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
                  dVar18 = local_b8 + ABS(dVar18);
                  local_b8 = dVar18;
                }
                lVar17 = lVar17 + 1;
                lVar12 = lVar12 + lVar13;
              } while (lVar11 != lVar17);
            }
            lVar17 = lVar10 * lVar11 + lVar3 + lVar10;
            dVar18 = cabs(*(double *)(this->fStorage).fStore[lVar17]._M_value);
            if (ABS(dVar18) < local_b8) {
              pcVar4 = (this->fStorage).fStore;
              *(double *)pcVar4[lVar17]._M_value = local_b8 + 1.0;
              *(undefined8 *)(pcVar4[lVar17]._M_value + 8) = 0;
            }
            lVar10 = lVar10 + 1;
            lVar14 = lVar14 + 0x10;
            lVar16 = lVar16 + lVar13;
          } while (lVar10 != lVar11);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != lVar9);
    }
    TPZManVector<int,_10>::~TPZManVector(&local_78);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzblockdiag.cpp"
             ,0x24f);
}

Assistant:

void TPZBlockDiagonal<TVar>::AutoFill(int64_t neq, int64_t jeq, int symmetric) {
    if (neq != jeq) {
        DebugStop();
    }
    TPZStack<int> blsizes;
    int64_t totalsize = 0;
    while (totalsize < neq) {
        int64_t blsize = (neq*rand())/RAND_MAX;
        blsize = blsize < neq-totalsize ? blsize : neq-totalsize;
        blsizes.Push(blsize);
        totalsize += blsize;
    }
    Initialize(blsizes);
    // Initialize the blocksizes!!
	int64_t b, bsize, eq = 0, pos;
	int64_t nb = fBlockSize.NElements(), r, c;
	for ( b=0; b<nb; b++) {
		pos= fBlockPos[b];
		bsize = fBlockSize[b];
		for(c=0; c<bsize; c++) {
            RTVar sum = 0.;
            r=0;
            if (symmetric == 1) {
                for (r=0; r<c; r++) {
                    fStorage[pos+c+r*bsize]=fStorage[pos+r+c*bsize];
                    sum += fabs(fStorage[pos+r+c*bsize]);
                }
            }
			for(; r<bsize; r++) {
				auto val = this->GetRandomVal();
				fStorage[pos+c+r*bsize] = (val);
                if(c!= r) sum += fabs(val);
			}
            //totototo
//            if(r==4)
//            {
//                std::cout << "sum " << sum << std::endl;
//            }
            if (fabs(fStorage[pos+c+c*bsize]) < sum) {
                fStorage[pos+c+c*bsize] = (TVar)(sum + (RTVar)1.);
            }
		}
		eq += bsize;
	}
}